

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

SymOpnd * __thiscall IR::SymOpnd::CloneUseInternal(SymOpnd *this,Func *func)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackSym *pSVar4;
  StackSym *this_00;
  Cloner *pCVar5;
  SymOpnd *pSVar6;
  SymOpnd *newOpnd;
  StackSym *newSym;
  StackSym *oldSym;
  Sym *sym;
  Func *func_local;
  SymOpnd *this_local;
  
  if ((this->super_Opnd).m_kind != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x2ea,"(m_kind == OpndKindSym)","m_kind == OpndKindSym");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  oldSym = (StackSym *)this->m_sym;
  bVar2 = Sym::IsStackSym((Sym *)oldSym);
  if ((bVar2) && (pSVar4 = Sym::AsStackSym((Sym *)oldSym), (*(uint *)&pSVar4->field_0x18 & 1) != 0))
  {
    pSVar4 = Sym::AsStackSym((Sym *)oldSym);
    this_00 = StackSym::CloneUse(pSVar4,func);
    oldSym = Sym::AsStackSym(&this_00->super_Sym);
    pCVar5 = Func::GetCloner(func);
    if (((pCVar5->clonedInstrGetOrigArgSlotSym & 1U) != 0) &&
       (bVar2 = StackSym::IsArgSlotSym(pSVar4), bVar2)) {
      if (oldSym == pSVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                           ,0x2f3,"(newSym != oldSym)","newSym != oldSym");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      this->m_sym = &oldSym->super_Sym;
      oldSym = pSVar4;
    }
  }
  pSVar6 = New(&oldSym->super_Sym,this->m_offset,(this->super_Opnd).m_type,func);
  return pSVar6;
}

Assistant:

SymOpnd *
SymOpnd::CloneUseInternal(Func *func)
{
    Assert(m_kind == OpndKindSym);
    Sym *sym = this->m_sym;

    if (sym->IsStackSym() && sym->AsStackSym()->m_isSingleDef)
    {
        StackSym * oldSym = sym->AsStackSym();
        StackSym * newSym = oldSym->CloneUse(func)->AsStackSym();
        if (func->GetCloner()->clonedInstrGetOrigArgSlotSym && oldSym->IsArgSlotSym())
        {
            Assert(newSym != oldSym);
            this->m_sym = newSym;
            sym = oldSym;
        }
        else
        {
            sym = newSym;
        }
    }

    SymOpnd * newOpnd = SymOpnd::New(sym, m_offset, m_type, func);

    return newOpnd;
}